

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

ProString * __thiscall
VcprojGenerator::firstInputFileName
          (ProString *__return_storage_ptr__,VcprojGenerator *this,ProString *extraCompilerName)

{
  QMakeProject *this_00;
  QList<ProString> *this_01;
  iterator variableName;
  iterator iVar1;
  ProStringList *pPVar2;
  long in_FS_OFFSET;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_70;
  ProString local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  local_70.b = (char (*) [7])0x2188d1;
  local_70.a = extraCompilerName;
  ProString::ProString<ProString_const&,char_const(&)[7]>(&local_60,&local_70);
  this_01 = &QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)&local_60)->
             super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  variableName = QList<ProString>::begin(this_01);
  iVar1 = QList<ProString>::end(this_01);
  do {
    if (variableName.i == iVar1.i) {
      ProString::ProString(__return_storage_ptr__);
      goto LAB_001c73fd;
    }
    pPVar2 = QMakeEvaluator::valuesRef
                       (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.project)->
                         super_QMakeEvaluator,(ProKey *)variableName.i);
    variableName.i = variableName.i + 1;
  } while ((pPVar2->super_QList<ProString>).d.size == 0);
  ProString::ProString(__return_storage_ptr__,(pPVar2->super_QList<ProString>).d.ptr);
LAB_001c73fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString VcprojGenerator::firstInputFileName(const ProString &extraCompilerName) const
{
    for (const ProString &var : project->values(ProKey(extraCompilerName + ".input"))) {
        const ProStringList &files = project->values(var.toKey());
        if (!files.isEmpty())
            return files.first();
    }
    return ProString();
}